

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeHardening
          (ChElementHexaANCF_3813_9 *this,double alpha,double *val,double *der)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  int i1;
  long lVar11;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  uVar3 = (this->m_DPVector1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (0 < (long)uVar3) {
    pdVar5 = (this->m_DPVector1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    dVar13 = *pdVar5;
    if (dVar13 <= alpha) {
      iVar2 = this->m_DPVector_size;
      lVar6 = (long)iVar2;
      if (1 < lVar6) {
        uVar12 = 1;
        lVar11 = 0;
        do {
          if (uVar3 == uVar12) goto LAB_006d727e;
          dVar13 = *(double *)((long)pdVar5 + lVar11 + 8);
          if (alpha <= dVar13) {
            if (((uVar3 <= uVar12 - 1) ||
                (uVar3 = (this->m_DPVector2).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows, (long)uVar3 <= (long)(uVar12 - 1))) || (uVar3 <= uVar12))
            goto LAB_006d727e;
            pdVar9 = (double *)((long)pdVar5 + lVar11 + 8);
            pdVar8 = (this->m_DPVector2).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            pdVar5 = (double *)((long)pdVar5 + lVar11);
            pdVar10 = (double *)((long)pdVar8 + lVar11 + 8);
            pdVar8 = (double *)((long)pdVar8 + lVar11);
            dVar13 = (alpha - pdVar9[-1]) / (dVar13 - pdVar9[-1]);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = pdVar10[-1];
            auVar16._8_8_ = 0;
            auVar16._0_8_ = dVar13 * *pdVar10;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = 1.0 - dVar13;
            auVar4 = vfmadd231sd_fma(auVar16,auVar18,auVar4);
            dVar13 = auVar4._0_8_;
            goto LAB_006d725e;
          }
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 8;
        } while (iVar2 != (int)uVar12);
      }
      if ((0 < iVar2) && (uVar12 = lVar6 - 1, uVar12 < uVar3)) {
        pdVar1 = pdVar5 + uVar12;
        if (alpha <= *pdVar1) {
          return;
        }
        uVar3 = (this->m_DPVector2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((((long)uVar12 < (long)uVar3) && (1 < iVar2)) && (uVar7 = lVar6 - 2, uVar7 < uVar3)) {
          pdVar8 = (this->m_DPVector2).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          pdVar9 = pdVar5 + uVar12;
          pdVar5 = pdVar5 + uVar7;
          pdVar10 = pdVar8 + uVar12;
          pdVar8 = pdVar8 + uVar7;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *pdVar8;
          auVar17._0_8_ = (*pdVar10 - *pdVar8) / (*pdVar1 - *pdVar5);
          auVar17._8_8_ = 0;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = alpha - *pdVar5;
          auVar4 = vfmadd213sd_fma(auVar15,auVar17,auVar21);
          dVar13 = auVar4._0_8_;
          goto LAB_006d725e;
        }
      }
    }
    else if ((1 < (this->m_DPVector2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  .m_storage.m_rows) && (uVar3 != 1)) {
      pdVar8 = (this->m_DPVector2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pdVar9 = pdVar5 + 1;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *pdVar8;
      pdVar10 = pdVar8 + 1;
      auVar20._0_8_ = (pdVar8[1] - *pdVar8) / (pdVar5[1] - dVar13);
      auVar20._8_8_ = 0;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = alpha - dVar13;
      auVar4 = vfmadd213sd_fma(auVar14,auVar20,auVar19);
      dVar13 = auVar4._0_8_;
LAB_006d725e:
      *val = dVar13;
      *der = (*pdVar10 - *pdVar8) / (*pdVar9 - *pdVar5);
      return;
    }
  }
LAB_006d727e:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeHardening(double alpha, double& val, double& der) {
    // Check if below the table range
    if (alpha < m_DPVector1(0)) {
        val = (m_DPVector2(1) - m_DPVector2(0)) / (m_DPVector1(1) - m_DPVector1(0)) * (alpha - m_DPVector1(0)) +
              m_DPVector2(0);
        der = (m_DPVector2(1) - m_DPVector2(0)) / (m_DPVector1(1) - m_DPVector1(0));
        return;
    }

    // Check if in range
    for (int i0 = 0, i1 = 1; i1 < m_DPVector_size; i0++, i1++) {
        if (alpha <= m_DPVector1(i1)) {
            double wx = (alpha - m_DPVector1(i0)) / (m_DPVector1(i1) - m_DPVector1(i0));
            val = (1.0 - wx) * m_DPVector2(i0) + wx * m_DPVector2(i1);
            der = (m_DPVector2(i1) - m_DPVector2(i0)) / (m_DPVector1(i1) - m_DPVector1(i0));
            return;
        }
    }

    // Check if above the table range
    if (alpha > m_DPVector1(m_DPVector_size - 1)) {
        int i0 = m_DPVector_size - 2;
        int i1 = m_DPVector_size - 1;
        val = (m_DPVector2(i1) - m_DPVector2(i0)) / (m_DPVector1(i1) - m_DPVector1(i0)) * (alpha - m_DPVector1(i0)) +
              m_DPVector2(i0);
        der = (m_DPVector2(i1) - m_DPVector2(i0)) / (m_DPVector1(i1) - m_DPVector1(i0));
    }
}